

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O2

Builder * embree::avx::BVH4Curve4vBuilder_OBB_New(void *bvh,Scene *scene,size_t mode)

{
  BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *this;
  
  this = (BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_> *)
         ::operator_new(0x78);
  BVHNHairBuilderSAH<4,_embree::CurveNv<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::
  BVHNHairBuilderSAH(this,(BVH *)bvh,scene);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4Curve4vBuilder_OBB_New   (void* bvh, Scene* scene, size_t mode) { return new BVHNHairBuilderSAH<4,Curve4v,Line4i,Point4i>((BVH4*)bvh,scene); }